

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s_print.c
# Opt level: O2

void glob_findinstance(t_pd *dummy,t_symbol *s)

{
  char *pcVar1;
  int iVar2;
  long obj;
  void *local_8;
  
  local_8 = (void *)0x0;
  if (((s != (t_symbol *)0x0) && (pcVar1 = s->s_name, pcVar1 != (char *)0x0)) &&
     ((*pcVar1 == '0' || (*pcVar1 == '.')))) {
    iVar2 = __isoc99_sscanf(pcVar1 + 1,"x%lx",&local_8);
    if ((iVar2 != 0) && (local_8 != (void *)0x0)) {
      canvas_finderror(local_8);
    }
  }
  return;
}

Assistant:

void glob_findinstance(t_pd *dummy, t_symbol*s)
{
    // revert s to (potential) pointer to object
    PD_LONGINTTYPE obj = 0;
    const char*addr;
    if(!s || !s->s_name)
        return;
    addr = s->s_name;
    if (('.' != addr[0]) && ('0' != addr[0]))
        return;
    if (!sscanf(addr+1, "x%lx", &obj))
        return;

    if(!obj)
        return;

    canvas_finderror((void *)obj);
}